

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_soft.c
# Opt level: O0

void shader_grad_any_first
               (uintptr_t state,int start_x,int start_y,ALLEGRO_VERTEX *v1,ALLEGRO_VERTEX *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ALLEGRO_VERTEX *in_RCX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  ALLEGRO_VERTEX *in_R8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ALLEGRO_COLOR v2c;
  ALLEGRO_COLOR v1c;
  ALLEGRO_COLOR diff;
  state_grad_any_2d *st;
  float major_delta_param;
  float minor_delta_param;
  float param;
  float local_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float local_50;
  float fStack_4c;
  float local_2c;
  float local_28;
  float local_24 [9];
  
  uVar1 = (in_RCX->color).r;
  uVar5 = (in_RCX->color).g;
  uVar2 = (in_RCX->color).b;
  uVar6 = (in_RCX->color).a;
  uVar3 = (in_R8->color).r;
  uVar7 = (in_R8->color).g;
  uVar4 = (in_R8->color).b;
  uVar8 = (in_R8->color).a;
  get_interpolation_parameters(in_ESI,in_EDX,in_RCX,in_R8,local_24,&local_28,&local_2c);
  fVar9 = (float)uVar8 - (float)uVar6;
  fVar10 = (float)uVar3 - (float)uVar1;
  fVar11 = (float)uVar7 - (float)uVar5;
  fVar12 = (float)uVar4 - (float)uVar2;
  in_RDI[3] = fVar9 * local_24[0] + (float)uVar6;
  *in_RDI = fVar10 * local_24[0] + (float)uVar1;
  in_RDI[1] = fVar11 * local_24[0] + (float)uVar5;
  in_RDI[2] = fVar12 * local_24[0] + (float)uVar2;
  in_RDI[7] = fVar9 * local_28;
  in_RDI[4] = fVar10 * local_28;
  in_RDI[5] = fVar11 * local_28;
  in_RDI[6] = fVar12 * local_28;
  in_RDI[0xb] = fVar9 * local_2c;
  in_RDI[8] = fVar10 * local_2c;
  in_RDI[9] = fVar11 * local_2c;
  in_RDI[10] = fVar12 * local_2c;
  return;
}

Assistant:

static void shader_grad_any_first(uintptr_t state, int start_x, int start_y, ALLEGRO_VERTEX* v1, ALLEGRO_VERTEX* v2)
{
   float param;
   float minor_delta_param;
   float major_delta_param;
   state_grad_any_2d* st = (state_grad_any_2d*)state;
   ALLEGRO_COLOR diff, v1c, v2c;

   v1c = v1->color;
   v2c = v2->color;

   get_interpolation_parameters(start_x, start_y, v1, v2, &param, &minor_delta_param, &major_delta_param);
  
   diff.a = v2c.a - v1c.a;
   diff.r = v2c.r - v1c.r;
   diff.g = v2c.g - v1c.g;
   diff.b = v2c.b - v1c.b;
   
   st->solid.color.a = v1c.a + diff.a * param;
   st->solid.color.r = v1c.r + diff.r * param;
   st->solid.color.g = v1c.g + diff.g * param;
   st->solid.color.b = v1c.b + diff.b * param;
   
   st->minor_color.a = diff.a * minor_delta_param;
   st->minor_color.r = diff.r * minor_delta_param;
   st->minor_color.g = diff.g * minor_delta_param;
   st->minor_color.b = diff.b * minor_delta_param;
   
   st->major_color.a = diff.a * major_delta_param;
   st->major_color.r = diff.r * major_delta_param;
   st->major_color.g = diff.g * major_delta_param;
   st->major_color.b = diff.b * major_delta_param;
}